

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

bool __thiscall QUrlModel::setData(QUrlModel *this,QModelIndex *index,QVariant *value,int role)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  int in_EDX;
  QVariant *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex dirIndex;
  QUrl url;
  bool local_1b9;
  undefined1 local_1b8 [48];
  undefined1 local_188 [48];
  undefined1 local_158 [48];
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  QUrl local_110;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = ::QVariant::userType((QVariant *)0x784ef3);
  if (iVar3 == 0x11) {
    local_110.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toUrl();
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    uVar1 = *(undefined8 *)(in_RDI + 0x18);
    QUrl::toLocalFile();
    QFileSystemModel::index((QString *)&local_128,(int)uVar1);
    QString::~QString((QString *)0x784f96);
    if (((byte)in_RDI[0x10] & 1) == 0) {
      (**(code **)(**(long **)(in_RDI + 0x18) + 0x90))
                (&local_88,*(long **)(in_RDI + 0x18),&local_128,0x101);
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)local_188);
      ::QVariant::QVariant(&local_68,(QString *)local_188);
      QStandardItemModel::setData(in_RDI,in_RSI,(int)&local_68);
      ::QVariant::~QVariant(&local_68);
      QString::~QString((QString *)0x785110);
      QString::~QString((QString *)0x78511d);
      ::QVariant::~QVariant(&local_88);
      (**(code **)(**(long **)(in_RDI + 0x18) + 0x90))
                (&local_c8,*(long **)(in_RDI + 0x18),&local_128,0);
      ::QVariant::toString();
      ::QVariant::QVariant(&local_a8,(QString *)local_1b8);
      QStandardItemModel::setData(in_RDI,in_RSI,(int)&local_a8);
      ::QVariant::~QVariant(&local_a8);
      QString::~QString((QString *)0x7851af);
      ::QVariant::~QVariant(&local_c8);
    }
    else {
      (**(code **)(**(long **)(in_RDI + 0x18) + 0x90))
                (&local_48,*(long **)(in_RDI + 0x18),&local_128,0x101);
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)local_158);
      ::QVariant::QVariant(&local_28,(QString *)local_158);
      QStandardItemModel::setData(in_RDI,in_RSI,(int)&local_28);
      ::QVariant::~QVariant(&local_28);
      QString::~QString((QString *)0x78504b);
      QString::~QString((QString *)0x785058);
      ::QVariant::~QVariant(&local_48);
    }
    (**(code **)(**(long **)(in_RDI + 0x18) + 0x90))
              (&local_e8,*(long **)(in_RDI + 0x18),&local_128,1);
    QStandardItemModel::setData(in_RDI,in_RSI,(int)&local_e8);
    ::QVariant::~QVariant(&local_e8);
    ::QVariant::QVariant(&local_108,(QUrl *)&local_110);
    QStandardItemModel::setData(in_RDI,in_RSI,(int)&local_108);
    ::QVariant::~QVariant(&local_108);
    local_1b9 = true;
    QUrl::~QUrl(&local_110);
  }
  else {
    bVar2 = QStandardItemModel::setData(in_RDI,in_RSI,in_EDX);
    local_1b9 = (bool)(bVar2 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1b9;
  }
  __stack_chk_fail();
}

Assistant:

bool QUrlModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (value.userType() == QMetaType::QUrl) {
        QUrl url = value.toUrl();
        QModelIndex dirIndex = fileSystemModel->index(url.toLocalFile());
        //On windows the popup display the "C:\", convert to nativeSeparators
        if (showFullPath)
            QStandardItemModel::setData(index, QDir::toNativeSeparators(fileSystemModel->data(dirIndex, QFileSystemModel::FilePathRole).toString()));
        else {
            QStandardItemModel::setData(index, QDir::toNativeSeparators(fileSystemModel->data(dirIndex, QFileSystemModel::FilePathRole).toString()), Qt::ToolTipRole);
            QStandardItemModel::setData(index, fileSystemModel->data(dirIndex).toString());
        }
        QStandardItemModel::setData(index, fileSystemModel->data(dirIndex, Qt::DecorationRole),
                                               Qt::DecorationRole);
        QStandardItemModel::setData(index, url, UrlRole);
        return true;
    }
    return QStandardItemModel::setData(index, value, role);
}